

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

_Bool ctl_arenas_i_verify(size_t i)

{
  uint uVar1;
  
  uVar1 = 0;
  if (i != 0x1000) {
    if (i == 0x1001) {
      uVar1 = 1;
    }
    else {
      uVar1 = 0;
      if ((ctl_arenas->narenas != i) &&
         (uVar1 = (int)i + 2, uVar1 == 0xffffffff || ctl_arenas->narenas <= i)) {
        return true;
      }
    }
  }
  return (_Bool)(ctl_arenas->duckdb_je_arenas[uVar1]->initialized ^ 1);
}

Assistant:

static bool
ctl_arenas_i_verify(size_t i) {
	size_t a = arenas_i2a_impl(i, true, true);
	if (a == UINT_MAX || !ctl_arenas->arenas[a]->initialized) {
		return true;
	}

	return false;
}